

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOptimizationTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Performance::ShaderOptimizationTests::init
          (ShaderOptimizationTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  TestCaseGroup *this_00;
  TestCaseGroup *this_01;
  TestCaseGroup *this_02;
  TestCaseGroup *this_03;
  TestCaseGroup *this_04;
  TestCaseGroup *this_05;
  ulong extraout_RAX;
  LoopUnrollCase *this_06;
  char *pcVar2;
  char *pcVar3;
  LoopInvariantCodeMotionCase *this_07;
  FunctionInliningCase *this_08;
  ConstantPropagationCase *this_09;
  CommonSubexpressionCase *this_10;
  DeadCodeEliminationCase *this_11;
  ulong uVar4;
  char *local_5e0;
  char *local_5d8;
  char *local_5d0;
  char *local_5c8;
  char *local_5c0;
  char *local_5b8;
  char *local_5b0;
  char *local_5a8;
  char *local_5a0;
  char *local_598;
  char *local_590;
  char *local_588;
  char *local_580;
  char *local_578;
  char *local_570;
  char *local_568;
  char *local_530;
  char *local_528;
  char *local_520;
  char *local_508;
  char *local_500;
  char *local_4f8;
  char *local_4c8;
  char *local_4c0;
  char *local_448;
  char *local_430;
  char *local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  char *local_380;
  char *caseTypeDescription;
  char *caseTypeName_3;
  CaseType local_368;
  CaseType caseType_3;
  int caseTypeI_3;
  allocator<char> local_339;
  string local_338 [8];
  string description_1;
  undefined1 local_310 [8];
  string caseTypeName_2;
  CaseType caseType_2;
  int caseTypeI_2;
  undefined1 local_2c8 [8];
  string name_3;
  int local_2a0;
  bool constantExpressionsOnly;
  int constantExpressionsOnlyI;
  string caseTypeName_1;
  CaseType caseType_1;
  int caseTypeI_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  undefined1 local_230 [8];
  string name_2;
  int nestingDepth;
  int nestDepthNdx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  undefined1 local_1c8 [8];
  string name_1;
  int loopIterations_1;
  int loopIterNdx_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  undefined1 local_160 [8];
  string description;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  undefined1 local_e0 [8];
  string name;
  int local_b8;
  int loopIterations;
  int loopIterNdx;
  string caseTypeDesc;
  undefined1 local_88 [8];
  string caseTypeName;
  CaseType caseType;
  int caseTypeI;
  char *caseShaderTypeSuffix;
  CaseShaderType caseShaderType;
  int caseShaderTypeI;
  TestCaseGroup *deadCodeEliminationGroup;
  TestCaseGroup *commonSubexpressionGroup;
  TestCaseGroup *constantPropagationGroup;
  TestCaseGroup *inlineGroup;
  TestCaseGroup *loopInvariantCodeMotionGroup;
  TestCaseGroup *unrollGroup;
  ShaderOptimizationTests *this_local;
  
  this_00 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_00,(this->super_TestCaseGroup).m_context,"loop_unrolling","Loop Unrolling Cases");
  this_01 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_01,(this->super_TestCaseGroup).m_context,"loop_invariant_code_motion",
             "Loop-Invariant Code Motion Cases");
  this_02 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_02,(this->super_TestCaseGroup).m_context,"function_inlining",
             "Function Inlining Cases");
  this_03 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_03,(this->super_TestCaseGroup).m_context,"constant_propagation",
             "Constant Propagation Cases");
  this_04 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_04,(this->super_TestCaseGroup).m_context,"common_subexpression_elimination",
             "Common Subexpression Elimination Cases");
  this_05 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_05,(this->super_TestCaseGroup).m_context,"dead_code_elimination",
             "Dead Code Elimination Cases");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_02);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_03);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_04);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_05);
  caseShaderTypeSuffix._4_4_ = CASESHADERTYPE_VERTEX;
  uVar4 = extraout_RAX;
  while ((int)caseShaderTypeSuffix._4_4_ < 2) {
    if (caseShaderTypeSuffix._4_4_ == CASESHADERTYPE_VERTEX) {
      local_428 = "_vertex";
    }
    else {
      local_428 = (char *)0x0;
      if (caseShaderTypeSuffix._4_4_ == CASESHADERTYPE_FRAGMENT) {
        local_428 = "_fragment";
      }
    }
    for (caseTypeName.field_2._12_4_ = 0; (int)caseTypeName.field_2._12_4_ < 2;
        caseTypeName.field_2._12_4_ = caseTypeName.field_2._12_4_ + 1) {
      caseTypeName.field_2._8_4_ = caseTypeName.field_2._12_4_;
      if (caseTypeName.field_2._12_4_ == 0) {
        local_430 = "independent_iterations";
      }
      else {
        local_430 = (char *)0x0;
        if (caseTypeName.field_2._12_4_ == 1) {
          local_430 = "dependent_iterations";
        }
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_88,local_430,
                 (allocator<char> *)(caseTypeDesc.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator((allocator<char> *)(caseTypeDesc.field_2._M_local_buf + 0xf))
      ;
      if (caseTypeName.field_2._8_4_ == 0) {
        local_448 = "loop iterations don\'t depend on each other";
      }
      else {
        local_448 = (char *)0x0;
        if (caseTypeName.field_2._8_4_ == 1) {
          local_448 = "loop iterations depend on each other";
        }
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&loopIterNdx,local_448,(allocator<char> *)((long)&loopIterations + 3));
      std::allocator<char>::~allocator((allocator<char> *)((long)&loopIterations + 3));
      for (local_b8 = 0; local_b8 < 3; local_b8 = local_b8 + 1) {
        name.field_2._12_4_ = init::loopIterationCounts[local_b8];
        std::operator+(&local_120,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88
                       ,"_");
        de::toString<int>((string *)((long)&description.field_2 + 8),
                          (int *)(name.field_2._M_local_buf + 0xc));
        std::operator+(&local_100,&local_120,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&description.field_2 + 8));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0
                       ,&local_100,local_428);
        std::__cxx11::string::~string((string *)&local_100);
        std::__cxx11::string::~string((string *)(description.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)&local_120);
        de::toString<int>((string *)&loopIterations_1,(int *)(name.field_2._M_local_buf + 0xc));
        std::operator+(&local_180,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &loopIterations_1," iterations; ");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_160,&local_180,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &loopIterNdx);
        std::__cxx11::string::~string((string *)&local_180);
        std::__cxx11::string::~string((string *)&loopIterations_1);
        this_06 = (LoopUnrollCase *)operator_new(0x358);
        pCVar1 = (this->super_TestCaseGroup).m_context;
        pcVar2 = (char *)std::__cxx11::string::c_str();
        pcVar3 = (char *)std::__cxx11::string::c_str();
        anon_unknown_1::LoopUnrollCase::LoopUnrollCase
                  (this_06,pCVar1,pcVar2,pcVar3,caseShaderTypeSuffix._4_4_,
                   caseTypeName.field_2._8_4_,name.field_2._12_4_);
        tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)this_06);
        std::__cxx11::string::~string((string *)local_160);
        std::__cxx11::string::~string((string *)local_e0);
      }
      std::__cxx11::string::~string((string *)&loopIterNdx);
      std::__cxx11::string::~string((string *)local_88);
    }
    for (name_1.field_2._12_4_ = 0; (int)name_1.field_2._12_4_ < 3;
        name_1.field_2._12_4_ = name_1.field_2._12_4_ + 1) {
      name_1.field_2._8_4_ = init()::loopIterationCounts[(int)name_1.field_2._12_4_];
      de::toString<int>((string *)&nestingDepth,(int *)(name_1.field_2._M_local_buf + 8));
      std::operator+(&local_1e8,(string *)&nestingDepth,"_iterations");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8,
                     &local_1e8,local_428);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&nestingDepth);
      this_07 = (LoopInvariantCodeMotionCase *)operator_new(0x358);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      pcVar2 = (char *)std::__cxx11::string::c_str();
      anon_unknown_1::LoopInvariantCodeMotionCase::LoopInvariantCodeMotionCase
                (this_07,pCVar1,pcVar2,"",caseShaderTypeSuffix._4_4_,name_1.field_2._8_4_);
      tcu::TestNode::addChild((TestNode *)this_01,(TestNode *)this_07);
      std::__cxx11::string::~string((string *)local_1c8);
    }
    for (name_2.field_2._12_4_ = 0; (int)name_2.field_2._12_4_ < 3;
        name_2.field_2._12_4_ = name_2.field_2._12_4_ + 1) {
      name_2.field_2._8_4_ = init::callNestingDepths[(int)name_2.field_2._12_4_];
      de::toString<int>((string *)&caseType_1,(int *)(name_2.field_2._M_local_buf + 8));
      std::operator+(&local_250,(string *)&caseType_1,"_nested");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230,
                     &local_250,local_428);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&caseType_1);
      this_08 = (FunctionInliningCase *)operator_new(0x358);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      pcVar2 = (char *)std::__cxx11::string::c_str();
      anon_unknown_1::FunctionInliningCase::FunctionInliningCase
                (this_08,pCVar1,pcVar2,"",caseShaderTypeSuffix._4_4_,name_2.field_2._8_4_);
      tcu::TestNode::addChild((TestNode *)this_02,(TestNode *)this_08);
      std::__cxx11::string::~string((string *)local_230);
    }
    for (caseTypeName_1.field_2._12_4_ = 0; (int)caseTypeName_1.field_2._12_4_ < 3;
        caseTypeName_1.field_2._12_4_ = caseTypeName_1.field_2._12_4_ + 1) {
      caseTypeName_1.field_2._8_4_ = caseTypeName_1.field_2._12_4_;
      if (caseTypeName_1.field_2._12_4_ == 0) {
        local_4c0 = "built_in_functions";
      }
      else {
        if (caseTypeName_1.field_2._12_4_ == 1) {
          local_4c8 = "array";
        }
        else {
          local_4c8 = (char *)0x0;
          if (caseTypeName_1.field_2._12_4_ == 2) {
            local_4c8 = "struct";
          }
        }
        local_4c0 = local_4c8;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&constantExpressionsOnlyI,local_4c0,
                 (allocator<char> *)&constantExpressionsOnly);
      std::allocator<char>::~allocator((allocator<char> *)&constantExpressionsOnly);
      for (local_2a0 = 0; local_2a0 < 2; local_2a0 = local_2a0 + 1) {
        name_3.field_2._M_local_buf[0xf] = local_2a0 != 0;
        pcVar2 = "_no_const";
        if ((bool)name_3.field_2._M_local_buf[0xf]) {
          pcVar2 = "";
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &caseType_2,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &constantExpressionsOnlyI,pcVar2);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &caseType_2,local_428);
        std::__cxx11::string::~string((string *)&caseType_2);
        this_09 = (ConstantPropagationCase *)operator_new(0x358);
        pCVar1 = (this->super_TestCaseGroup).m_context;
        pcVar2 = (char *)std::__cxx11::string::c_str();
        anon_unknown_1::ConstantPropagationCase::ConstantPropagationCase
                  (this_09,pCVar1,pcVar2,"",caseShaderTypeSuffix._4_4_,caseTypeName_1.field_2._8_4_,
                   (bool)(name_3.field_2._M_local_buf[0xf] & 1));
        tcu::TestNode::addChild((TestNode *)this_03,(TestNode *)this_09);
        std::__cxx11::string::~string((string *)local_2c8);
      }
      std::__cxx11::string::~string((string *)&constantExpressionsOnlyI);
    }
    for (caseTypeName_2.field_2._12_4_ = 0; (int)caseTypeName_2.field_2._12_4_ < 4;
        caseTypeName_2.field_2._12_4_ = caseTypeName_2.field_2._12_4_ + 1) {
      caseTypeName_2.field_2._8_4_ = caseTypeName_2.field_2._12_4_;
      if (caseTypeName_2.field_2._12_4_ == 0) {
        local_4f8 = "single_statement";
      }
      else {
        if (caseTypeName_2.field_2._12_4_ == 1) {
          local_500 = "multiple_statements";
        }
        else {
          if (caseTypeName_2.field_2._12_4_ == 2) {
            local_508 = "static_branch";
          }
          else {
            local_508 = (char *)0x0;
            if (caseTypeName_2.field_2._12_4_ == 3) {
              local_508 = "loop";
            }
          }
          local_500 = local_508;
        }
        local_4f8 = local_500;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_310,local_4f8,
                 (allocator<char> *)(description_1.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator
                ((allocator<char> *)(description_1.field_2._M_local_buf + 0xf));
      if (caseTypeName_2.field_2._8_4_ == 0) {
        local_520 = "A single statement containing multiple uses of same subexpression";
      }
      else {
        if (caseTypeName_2.field_2._8_4_ == 1) {
          local_528 = "Multiple statements performing same computations";
        }
        else {
          if (caseTypeName_2.field_2._8_4_ == 2) {
            local_530 = "Multiple statements including a static conditional";
          }
          else {
            local_530 = (char *)0x0;
            if (caseTypeName_2.field_2._8_4_ == 3) {
              local_530 = "Multiple loops performing the same computations";
            }
          }
          local_528 = local_530;
        }
        local_520 = local_528;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_338,local_520,&local_339);
      std::allocator<char>::~allocator(&local_339);
      this_10 = (CommonSubexpressionCase *)operator_new(0x358);
      caseType_3._3_1_ = 1;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &caseTypeI_3,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_310,
                     local_428);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      pcVar3 = (char *)std::__cxx11::string::c_str();
      anon_unknown_1::CommonSubexpressionCase::CommonSubexpressionCase
                (this_10,pCVar1,pcVar2,pcVar3,caseShaderTypeSuffix._4_4_,
                 caseTypeName_2.field_2._8_4_);
      caseType_3._3_1_ = CASETYPE_DEAD_BRANCH_SIMPLE >> 0x18;
      tcu::TestNode::addChild((TestNode *)this_04,(TestNode *)this_10);
      std::__cxx11::string::~string((string *)&caseTypeI_3);
      std::__cxx11::string::~string(local_338);
      std::__cxx11::string::~string((string *)local_310);
    }
    for (local_368 = CASETYPE_DEAD_BRANCH_SIMPLE; (int)local_368 < 9;
        local_368 = local_368 + CASETYPE_DEAD_BRANCH_COMPLEX) {
      caseTypeName_3._4_4_ = local_368;
      if (local_368 == CASETYPE_DEAD_BRANCH_SIMPLE) {
        local_568 = "dead_branch_simple";
      }
      else {
        if (local_368 == CASETYPE_DEAD_BRANCH_COMPLEX) {
          local_570 = "dead_branch_complex";
        }
        else {
          if (local_368 == CASETYPE_DEAD_BRANCH_COMPLEX_NO_CONST) {
            local_578 = "dead_branch_complex_no_const";
          }
          else {
            if (local_368 == CASETYPE_DEAD_BRANCH_FUNC_CALL) {
              local_580 = "dead_branch_func_call";
            }
            else {
              if (local_368 == CASETYPE_UNUSED_VALUE_BASIC) {
                local_588 = "unused_value_basic";
              }
              else {
                if (local_368 == CASETYPE_UNUSED_VALUE_LOOP) {
                  local_590 = "unused_value_loop";
                }
                else {
                  if (local_368 == CASETYPE_UNUSED_VALUE_DEAD_BRANCH) {
                    local_598 = "unused_value_dead_branch";
                  }
                  else {
                    if (local_368 == CASETYPE_UNUSED_VALUE_AFTER_RETURN) {
                      local_5a0 = "unused_value_after_return";
                    }
                    else {
                      local_5a0 = (char *)0x0;
                      if (local_368 == CASETYPE_UNUSED_VALUE_MUL_ZERO) {
                        local_5a0 = "unused_value_mul_zero";
                      }
                    }
                    local_598 = local_5a0;
                  }
                  local_590 = local_598;
                }
                local_588 = local_590;
              }
              local_580 = local_588;
            }
            local_578 = local_580;
          }
          local_570 = local_578;
        }
        local_568 = local_570;
      }
      caseTypeDescription = local_568;
      if (local_368 == CASETYPE_DEAD_BRANCH_SIMPLE) {
        local_5a8 = 
        "Do computation inside a branch that is never taken (condition is simple false constant expression)"
        ;
      }
      else {
        if (local_368 == CASETYPE_DEAD_BRANCH_COMPLEX) {
          local_5b0 = 
          "Do computation inside a branch that is never taken (condition is complex false constant expression)"
          ;
        }
        else {
          if (local_368 == CASETYPE_DEAD_BRANCH_COMPLEX_NO_CONST) {
            local_5b8 = 
            "Do computation inside a branch that is never taken (condition is complex false expression, not constant expression but still compile-time computable)"
            ;
          }
          else {
            if (local_368 == CASETYPE_DEAD_BRANCH_FUNC_CALL) {
              local_5c0 = 
              "Do computation inside a branch that is never taken (condition is compile-time computable false expression containing function call to a simple inlineable function)"
              ;
            }
            else {
              if (local_368 == CASETYPE_UNUSED_VALUE_BASIC) {
                local_5c8 = "Compute a value that is never used even statically";
              }
              else {
                if (local_368 == CASETYPE_UNUSED_VALUE_LOOP) {
                  local_5d0 = "Compute a value, using a loop, that is never used even statically";
                }
                else {
                  if (local_368 == CASETYPE_UNUSED_VALUE_DEAD_BRANCH) {
                    local_5d8 = "Compute a value that is used only inside a statically dead branch";
                  }
                  else {
                    if (local_368 == CASETYPE_UNUSED_VALUE_AFTER_RETURN) {
                      local_5e0 = "Compute a value that is used only after a return statement";
                    }
                    else {
                      local_5e0 = (char *)0x0;
                      if (local_368 == CASETYPE_UNUSED_VALUE_MUL_ZERO) {
                        local_5e0 = 
                        "Compute a value that is used but multiplied by a zero constant expression";
                      }
                    }
                    local_5d8 = local_5e0;
                  }
                  local_5d0 = local_5d8;
                }
                local_5c8 = local_5d0;
              }
              local_5c0 = local_5c8;
            }
            local_5b8 = local_5c0;
          }
          local_5b0 = local_5b8;
        }
        local_5a8 = local_5b0;
      }
      local_380 = local_5a8;
      this_11 = (DeadCodeEliminationCase *)operator_new(0x358);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      std::__cxx11::string::string((string *)&local_3e0);
      std::operator+(&local_3c0,&local_3e0,caseTypeDescription);
      std::operator+(&local_3a0,&local_3c0,local_428);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      anon_unknown_1::DeadCodeEliminationCase::DeadCodeEliminationCase
                (this_11,pCVar1,pcVar2,local_380,caseShaderTypeSuffix._4_4_,caseTypeName_3._4_4_);
      tcu::TestNode::addChild((TestNode *)this_05,(TestNode *)this_11);
      std::__cxx11::string::~string((string *)&local_3a0);
      std::__cxx11::string::~string((string *)&local_3c0);
      std::__cxx11::string::~string((string *)&local_3e0);
    }
    caseShaderTypeSuffix._4_4_ = caseShaderTypeSuffix._4_4_ + CASESHADERTYPE_FRAGMENT;
    uVar4 = (ulong)caseShaderTypeSuffix._4_4_;
  }
  return (int)uVar4;
}

Assistant:

void ShaderOptimizationTests::init (void)
{
	TestCaseGroup* const unrollGroup					= new TestCaseGroup(m_context, "loop_unrolling",					"Loop Unrolling Cases");
	TestCaseGroup* const loopInvariantCodeMotionGroup	= new TestCaseGroup(m_context, "loop_invariant_code_motion",		"Loop-Invariant Code Motion Cases");
	TestCaseGroup* const inlineGroup					= new TestCaseGroup(m_context, "function_inlining",					"Function Inlining Cases");
	TestCaseGroup* const constantPropagationGroup		= new TestCaseGroup(m_context, "constant_propagation",				"Constant Propagation Cases");
	TestCaseGroup* const commonSubexpressionGroup		= new TestCaseGroup(m_context, "common_subexpression_elimination",	"Common Subexpression Elimination Cases");
	TestCaseGroup* const deadCodeEliminationGroup		= new TestCaseGroup(m_context, "dead_code_elimination",				"Dead Code Elimination Cases");
	addChild(unrollGroup);
	addChild(loopInvariantCodeMotionGroup);
	addChild(inlineGroup);
	addChild(constantPropagationGroup);
	addChild(commonSubexpressionGroup);
	addChild(deadCodeEliminationGroup);

	for (int caseShaderTypeI = 0; caseShaderTypeI < CASESHADERTYPE_LAST; caseShaderTypeI++)
	{
		const CaseShaderType	caseShaderType			= (CaseShaderType)caseShaderTypeI;
		const char* const		caseShaderTypeSuffix	= caseShaderType == CASESHADERTYPE_VERTEX		? "_vertex"
														: caseShaderType == CASESHADERTYPE_FRAGMENT		? "_fragment"
														: DE_NULL;

		// Loop unrolling cases.

		{
			static const int loopIterationCounts[] = { 4, 8, 32 };

			for (int caseTypeI = 0; caseTypeI < LoopUnrollCase::CASETYPE_LAST; caseTypeI++)
			{
				const LoopUnrollCase::CaseType	caseType		= (LoopUnrollCase::CaseType)caseTypeI;
				const string					caseTypeName	= caseType == LoopUnrollCase::CASETYPE_INDEPENDENT	? "independent_iterations"
																: caseType == LoopUnrollCase::CASETYPE_DEPENDENT	? "dependent_iterations"
																: DE_NULL;
				const string					caseTypeDesc	= caseType == LoopUnrollCase::CASETYPE_INDEPENDENT	? "loop iterations don't depend on each other"
																: caseType == LoopUnrollCase::CASETYPE_DEPENDENT	? "loop iterations depend on each other"
																: DE_NULL;

				for (int loopIterNdx = 0; loopIterNdx < DE_LENGTH_OF_ARRAY(loopIterationCounts); loopIterNdx++)
				{
					const int			loopIterations	= loopIterationCounts[loopIterNdx];
					const string		name			= caseTypeName + "_" + toString(loopIterations) + caseShaderTypeSuffix;
					const string		description		= toString(loopIterations) + " iterations; " + caseTypeDesc;

					unrollGroup->addChild(new LoopUnrollCase(m_context, name.c_str(), description.c_str(), caseShaderType, caseType, loopIterations));
				}
			}
		}

		// Loop-invariant code motion cases.

		{
			static const int loopIterationCounts[] = { 4, 8, 32 };

			for (int loopIterNdx = 0; loopIterNdx < DE_LENGTH_OF_ARRAY(loopIterationCounts); loopIterNdx++)
			{
				const int		loopIterations	= loopIterationCounts[loopIterNdx];
				const string	name			= toString(loopIterations) + "_iterations" + caseShaderTypeSuffix;

				loopInvariantCodeMotionGroup->addChild(new LoopInvariantCodeMotionCase(m_context, name.c_str(), "", caseShaderType, loopIterations));
			}
		}

		// Function inlining cases.

		{
			static const int callNestingDepths[] = { 4, 8, 32 };

			for (int nestDepthNdx = 0; nestDepthNdx < DE_LENGTH_OF_ARRAY(callNestingDepths); nestDepthNdx++)
			{
				const int		nestingDepth	= callNestingDepths[nestDepthNdx];
				const string	name			= toString(nestingDepth) + "_nested" + caseShaderTypeSuffix;

				inlineGroup->addChild(new FunctionInliningCase(m_context, name.c_str(), "", caseShaderType, nestingDepth));
			}
		}

		// Constant propagation cases.

		for (int caseTypeI = 0; caseTypeI < ConstantPropagationCase::CASETYPE_LAST; caseTypeI++)
		{
			const ConstantPropagationCase::CaseType		caseType		= (ConstantPropagationCase::CaseType)caseTypeI;
			const string								caseTypeName	= caseType == ConstantPropagationCase::CASETYPE_BUILT_IN_FUNCTIONS		? "built_in_functions"
																		: caseType == ConstantPropagationCase::CASETYPE_ARRAY					? "array"
																		: caseType == ConstantPropagationCase::CASETYPE_STRUCT					? "struct"
																		: DE_NULL;

			for (int constantExpressionsOnlyI = 0; constantExpressionsOnlyI <= 1; constantExpressionsOnlyI++)
			{
				const bool		constantExpressionsOnly		= constantExpressionsOnlyI != 0;
				const string	name						= caseTypeName + (constantExpressionsOnly ? "" : "_no_const") + caseShaderTypeSuffix;

				constantPropagationGroup->addChild(new ConstantPropagationCase(m_context, name.c_str(), "", caseShaderType, caseType, constantExpressionsOnly));
			}
		}

		// Common subexpression cases.

		for (int caseTypeI = 0; caseTypeI < CommonSubexpressionCase::CASETYPE_LAST; caseTypeI++)
		{
			const CommonSubexpressionCase::CaseType		caseType		= (CommonSubexpressionCase::CaseType)caseTypeI;

			const string								caseTypeName	= caseType == CommonSubexpressionCase::CASETYPE_SINGLE_STATEMENT		? "single_statement"
																		: caseType == CommonSubexpressionCase::CASETYPE_MULTIPLE_STATEMENTS		? "multiple_statements"
																		: caseType == CommonSubexpressionCase::CASETYPE_STATIC_BRANCH			? "static_branch"
																		: caseType == CommonSubexpressionCase::CASETYPE_LOOP					? "loop"
																		: DE_NULL;

			const string								description		= caseType == CommonSubexpressionCase::CASETYPE_SINGLE_STATEMENT		? "A single statement containing multiple uses of same subexpression"
																		: caseType == CommonSubexpressionCase::CASETYPE_MULTIPLE_STATEMENTS		? "Multiple statements performing same computations"
																		: caseType == CommonSubexpressionCase::CASETYPE_STATIC_BRANCH			? "Multiple statements including a static conditional"
																		: caseType == CommonSubexpressionCase::CASETYPE_LOOP					? "Multiple loops performing the same computations"
																		: DE_NULL;

			commonSubexpressionGroup->addChild(new CommonSubexpressionCase(m_context, (caseTypeName + caseShaderTypeSuffix).c_str(), description.c_str(), caseShaderType, caseType));
		}

		// Dead code elimination cases.

		for (int caseTypeI = 0; caseTypeI < DeadCodeEliminationCase::CASETYPE_LAST; caseTypeI++)
		{
			const DeadCodeEliminationCase::CaseType		caseType				= (DeadCodeEliminationCase::CaseType)caseTypeI;
			const char* const							caseTypeName			= caseType == DeadCodeEliminationCase::CASETYPE_DEAD_BRANCH_SIMPLE				? "dead_branch_simple"
																				: caseType == DeadCodeEliminationCase::CASETYPE_DEAD_BRANCH_COMPLEX				? "dead_branch_complex"
																				: caseType == DeadCodeEliminationCase::CASETYPE_DEAD_BRANCH_COMPLEX_NO_CONST	? "dead_branch_complex_no_const"
																				: caseType == DeadCodeEliminationCase::CASETYPE_DEAD_BRANCH_FUNC_CALL			? "dead_branch_func_call"
																				: caseType == DeadCodeEliminationCase::CASETYPE_UNUSED_VALUE_BASIC				? "unused_value_basic"
																				: caseType == DeadCodeEliminationCase::CASETYPE_UNUSED_VALUE_LOOP				? "unused_value_loop"
																				: caseType == DeadCodeEliminationCase::CASETYPE_UNUSED_VALUE_DEAD_BRANCH		? "unused_value_dead_branch"
																				: caseType == DeadCodeEliminationCase::CASETYPE_UNUSED_VALUE_AFTER_RETURN		? "unused_value_after_return"
																				: caseType == DeadCodeEliminationCase::CASETYPE_UNUSED_VALUE_MUL_ZERO			? "unused_value_mul_zero"
																				: DE_NULL;

			const char* const							caseTypeDescription		= caseType == DeadCodeEliminationCase::CASETYPE_DEAD_BRANCH_SIMPLE				? "Do computation inside a branch that is never taken (condition is simple false constant expression)"
																				: caseType == DeadCodeEliminationCase::CASETYPE_DEAD_BRANCH_COMPLEX				? "Do computation inside a branch that is never taken (condition is complex false constant expression)"
																				: caseType == DeadCodeEliminationCase::CASETYPE_DEAD_BRANCH_COMPLEX_NO_CONST	? "Do computation inside a branch that is never taken (condition is complex false expression, not constant expression but still compile-time computable)"
																				: caseType == DeadCodeEliminationCase::CASETYPE_DEAD_BRANCH_FUNC_CALL			? "Do computation inside a branch that is never taken (condition is compile-time computable false expression containing function call to a simple inlineable function)"
																				: caseType == DeadCodeEliminationCase::CASETYPE_UNUSED_VALUE_BASIC				? "Compute a value that is never used even statically"
																				: caseType == DeadCodeEliminationCase::CASETYPE_UNUSED_VALUE_LOOP				? "Compute a value, using a loop, that is never used even statically"
																				: caseType == DeadCodeEliminationCase::CASETYPE_UNUSED_VALUE_DEAD_BRANCH		? "Compute a value that is used only inside a statically dead branch"
																				: caseType == DeadCodeEliminationCase::CASETYPE_UNUSED_VALUE_AFTER_RETURN		? "Compute a value that is used only after a return statement"
																				: caseType == DeadCodeEliminationCase::CASETYPE_UNUSED_VALUE_MUL_ZERO			? "Compute a value that is used but multiplied by a zero constant expression"
																				: DE_NULL;

			deadCodeEliminationGroup->addChild(new DeadCodeEliminationCase(m_context, (string() + caseTypeName + caseShaderTypeSuffix).c_str(), caseTypeDescription, caseShaderType, caseType));
		}
	}
}